

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_decoder.cpp
# Opt level: O2

void __thiscall duckdb::DictionaryDecoder::InitializePage(DictionaryDecoder *this)

{
  pointer __p;
  ResizeableBuffer *pRVar1;
  ResizeableBuffer *pRVar2;
  shared_ptr<duckdb::ResizeableBuffer,_true> *this_00;
  uchar dict_width;
  uchar local_31;
  pointer local_30;
  
  this_00 = &this->reader->block;
  pRVar1 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(this_00);
  local_31 = ByteBuffer::read<unsigned_char>(&pRVar1->super_ByteBuffer);
  pRVar1 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(this_00);
  pRVar2 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(this_00);
  make_uniq<duckdb::RleBpDecoder,unsigned_char*&,unsigned_long&,unsigned_char&>
            ((duckdb *)&local_30,(uchar **)pRVar1,&(pRVar2->super_ByteBuffer).len,&local_31);
  __p = local_30;
  local_30 = (pointer)0x0;
  ::std::__uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>::reset
            ((__uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_> *)
             &this->dict_decoder,__p);
  ::std::unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>::~unique_ptr
            ((unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_> *)
             &local_30);
  pRVar1 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(this_00);
  pRVar2 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(this_00);
  ByteBuffer::inc(&pRVar1->super_ByteBuffer,(pRVar2->super_ByteBuffer).len);
  return;
}

Assistant:

void DictionaryDecoder::InitializePage() {
	// where is it otherwise??
	auto &block = reader.block;
	auto dict_width = block->read<uint8_t>();
	dict_decoder = make_uniq<RleBpDecoder>(block->ptr, block->len, dict_width);
	block->inc(block->len);
}